

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O0

uint32_t FastPForLib::Simple8b_Codec::tryRunLength(uint32_t *input,uint32_t pos,uint32_t count)

{
  uint uVar1;
  uint32_t uVar2;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  bool bVar3;
  uint32_t repeatCount;
  uint32_t bitLen;
  uint32_t test;
  uint32_t endPos;
  uint32_t startPos;
  undefined4 local_34;
  undefined4 local_14;
  undefined4 local_4;
  
  local_14 = in_ESI + 1;
  uVar1 = *(uint *)(in_RDI + (ulong)in_ESI * 4);
  if ((ulong)uVar1 < 0x100000000) {
    while( true ) {
      bVar3 = false;
      if (local_14 < in_ESI + in_EDX) {
        bVar3 = uVar1 == *(uint *)(in_RDI + (ulong)local_14 * 4);
      }
      if (!bVar3) break;
      local_14 = local_14 + 1;
    }
    uVar2 = bits(uVar1 | 1);
    local_34 = local_14 - in_ESI;
    if (uVar2 * local_34 < 0x3c) {
      local_34 = 0;
    }
    local_4 = local_34;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static uint32_t tryRunLength(const uint32_t *input, uint32_t pos,
                               uint32_t count) {
    uint32_t startPos = pos;
    uint32_t endPos = pos + count;
    uint32_t test = input[pos++];
    if (test > RLE_MAX_VALUE_MASK)
      return 0;
    while (pos < endPos && test == input[pos]) {
      pos++;
    }
    uint32_t bitLen = bits(test | 1U);
    uint32_t repeatCount = (pos - startPos);
    return (bitLen * repeatCount >= SIMPLE8B_BITSIZE) ? repeatCount : 0;
  }